

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

uint32_t duckdb_snappy::anon_unknown_3::CalculateTableSize(uint32_t input_size)

{
  int iVar1;
  uint in_EDI;
  undefined4 local_4;
  
  if (in_EDI < 0x8001) {
    if (in_EDI < 0x100) {
      local_4 = 0x100;
    }
    else {
      iVar1 = Bits::Log2Floor(0);
      local_4 = 2 << ((byte)iVar1 & 0x1f);
    }
  }
  else {
    local_4 = 0x8000;
  }
  return local_4;
}

Assistant:

uint32_t CalculateTableSize(uint32_t input_size) {
  static_assert(
      kMaxHashTableSize >= kMinHashTableSize,
      "kMaxHashTableSize should be greater or equal to kMinHashTableSize.");
  if (input_size > kMaxHashTableSize) {
    return kMaxHashTableSize;
  }
  if (input_size < kMinHashTableSize) {
    return kMinHashTableSize;
  }
  // This is equivalent to Log2Ceiling(input_size), assuming input_size > 1.
  // 2 << Log2Floor(x - 1) is equivalent to 1 << (1 + Log2Floor(x - 1)).
  return 2u << Bits::Log2Floor(input_size - 1);
}